

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

bool __thiscall spectest::JSONParser::Match(JSONParser *this,char *s)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  size_t sVar4;
  undefined8 uVar5;
  size_t sVar6;
  int iVar7;
  bool bVar8;
  size_t start_offset;
  Location start_loc;
  char *s_local;
  JSONParser *this_local;
  
  SkipWhitespace(this);
  pcVar2 = (this->loc_).filename.data_;
  sVar3 = (this->loc_).filename.size_;
  sVar4 = (this->loc_).field_1.field_1.offset;
  uVar5 = *(undefined8 *)((long)&(this->loc_).field_1 + 8);
  sVar6 = this->json_offset_;
  start_loc.field_1._8_8_ = s;
  while( true ) {
    bVar8 = false;
    if (*(char *)start_loc.field_1._8_8_ != '\0') {
      cVar1 = *(char *)start_loc.field_1._8_8_;
      iVar7 = ReadChar(this);
      bVar8 = cVar1 == iVar7;
    }
    if (!bVar8) break;
    start_loc.field_1._8_8_ = start_loc.field_1._8_8_ + 1;
  }
  cVar1 = *(char *)start_loc.field_1._8_8_;
  if (cVar1 != '\0') {
    this->json_offset_ = sVar6;
    (this->loc_).filename.data_ = pcVar2;
    (this->loc_).filename.size_ = sVar3;
    (this->loc_).field_1.field_1.offset = sVar4;
    *(undefined8 *)((long)&(this->loc_).field_1 + 8) = uVar5;
  }
  this_local._7_1_ = cVar1 == '\0';
  return this_local._7_1_;
}

Assistant:

bool JSONParser::Match(const char* s) {
  SkipWhitespace();
  Location start_loc = loc_;
  size_t start_offset = json_offset_;
  while (*s && *s == ReadChar())
    s++;

  if (*s == 0) {
    return true;
  } else {
    json_offset_ = start_offset;
    loc_ = start_loc;
    return false;
  }
}